

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_hqresize.cpp
# Opt level: O3

void scale3x(uint32 *input,uint32 *output,size_t width,size_t height)

{
  ulong uVar1;
  size_t sVar2;
  uint32 uVar3;
  uint32 uVar4;
  uint32 uVar5;
  uint32 uVar6;
  uint32 uVar7;
  uint32 uVar8;
  uint32 uVar9;
  ulong uVar10;
  uint32 uVar11;
  int iVar12;
  uint32 uVar13;
  long lVar14;
  long lVar15;
  uint32 uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  uint32 uVar20;
  uint32 uVar21;
  uint32 *puVar22;
  long lVar23;
  uint32 uVar24;
  bool bVar25;
  uint32 *local_f0;
  uint32 *local_e0;
  uint32 *local_d8;
  long local_d0;
  
  if (width != 0) {
    local_d8 = output + width * 6 + 1;
    local_e0 = output + width * 3 + 2;
    local_d0 = 0;
    uVar10 = 0;
    local_f0 = output;
    do {
      uVar1 = uVar10 + 1;
      if (height != 0) {
        uVar17 = uVar10;
        if (uVar10 < width - 1) {
          uVar17 = uVar1;
        }
        iVar12 = (int)uVar10 + -1;
        if (uVar10 == 0) {
          iVar12 = 0;
        }
        lVar14 = (long)(int)uVar17;
        lVar23 = 0;
        puVar22 = input;
        uVar17 = 0;
        do {
          lVar15 = 0;
          if (uVar17 != 0) {
            lVar15 = uVar17 - 1;
          }
          sVar2 = uVar17 + 1;
          uVar18 = uVar17;
          if (uVar17 < height - 1) {
            uVar18 = sVar2;
          }
          uVar3 = *(uint32 *)
                   ((long)puVar22 +
                   ((long)((local_d0 + (ulong)(uVar10 != 0) * -4) * 0x40000000) >> 0x1e));
          uVar21 = *(uint32 *)((long)puVar22 + local_d0);
          uVar11 = puVar22[lVar14];
          if (uVar3 == uVar11) {
LAB_004606d1:
            local_f0[lVar23] = uVar21;
            local_e0[lVar23 + -2] = uVar21;
            lVar15 = width * 6 + lVar23;
            local_d8[lVar23 + -1] = uVar21;
            local_f0[lVar23 + 1] = uVar21;
            local_e0[lVar23 + -1] = uVar21;
            local_d8[lVar23] = uVar21;
            local_f0[lVar23 + 2] = uVar21;
            local_e0[lVar23] = uVar21;
          }
          else {
            lVar15 = lVar15 * width;
            lVar19 = uVar18 * width;
            uVar4 = input[uVar10 + lVar15];
            uVar5 = input[uVar10 + lVar19];
            if (uVar4 == uVar5) goto LAB_004606d1;
            uVar6 = uVar4;
            if (uVar21 == input[iVar12 + lVar15]) {
              uVar6 = uVar21;
            }
            if (uVar4 != uVar11) {
              uVar6 = uVar21;
            }
            uVar16 = uVar5;
            if (uVar21 == input[iVar12 + lVar19]) {
              uVar16 = uVar21;
            }
            uVar7 = uVar11;
            uVar13 = uVar4;
            if (uVar21 == input[lVar14 + lVar15]) {
              uVar7 = uVar21;
              uVar13 = uVar6;
            }
            uVar24 = uVar21;
            uVar8 = uVar21;
            uVar20 = uVar21;
            if (uVar11 == uVar5) {
              uVar24 = uVar5;
              uVar8 = uVar16;
              uVar20 = uVar7;
            }
            uVar16 = uVar11;
            uVar7 = uVar5;
            if (uVar21 == input[lVar14 + lVar19]) {
              uVar16 = uVar20;
              uVar7 = uVar8;
            }
            uVar9 = uVar4;
            if (uVar4 != uVar11) {
              uVar16 = uVar20;
              uVar9 = uVar21;
            }
            uVar11 = uVar21;
            if (uVar21 != input[iVar12 + lVar15]) {
              uVar11 = uVar3;
            }
            if (uVar3 != uVar5) {
              uVar11 = uVar21;
            }
            uVar20 = uVar3;
            if (uVar21 == input[iVar12 + lVar19]) {
              uVar20 = uVar11;
            }
            if (uVar3 != uVar5) {
              uVar5 = uVar21;
              uVar7 = uVar8;
            }
            lVar15 = (uVar17 * 3 + 2) * width * 3;
            bVar25 = uVar4 != uVar3;
            if (bVar25) {
              uVar4 = uVar21;
            }
            local_f0[lVar23] = uVar4;
            if (bVar25) {
              uVar20 = uVar11;
            }
            local_e0[lVar23 + -2] = uVar20;
            local_d8[lVar23 + -1] = uVar5;
            if (bVar25) {
              uVar13 = uVar6;
            }
            local_f0[lVar23 + 1] = uVar13;
            local_e0[lVar23 + -1] = uVar21;
            local_d8[lVar23] = uVar7;
            local_f0[lVar23 + 2] = uVar9;
            local_e0[lVar23] = uVar16;
            uVar21 = uVar24;
          }
          output[uVar10 * 3 + lVar15 + 2] = uVar21;
          lVar23 = lVar23 + width * 9;
          puVar22 = puVar22 + width;
          uVar17 = sVar2;
        } while (sVar2 != height);
      }
      local_d8 = local_d8 + 3;
      local_e0 = local_e0 + 3;
      local_f0 = local_f0 + 3;
      local_d0 = local_d0 + 4;
      uVar10 = uVar1;
    } while (uVar1 != width);
  }
  return;
}

Assistant:

static void scale3x(uint32* const input, uint32* const output, const size_t width, const size_t height)
{
	const size_t scaledWidth = 3 * width;

	for (size_t i = 0; i < width; ++i)
	{
		const int iMinus = (i > 0        ) ? (i - 1) : 0;
		const int iPlus  = (i < width - 1) ? (i + 1) : i;

		for (size_t j = 0; j < height; ++j)
		{
			const size_t jMinus = (j > 0          ) ? (j - 1) : 0;
			const size_t jPlus  = (j < height - 1 ) ? (j + 1) : j;

			const uint32 A = input[iMinus + width * jMinus];
			const uint32 B = input[iMinus + width * j     ];
			const uint32 C = input[iMinus + width * jPlus ];
			const uint32 D = input[i      + width * jMinus];
			const uint32 E = input[i      + width * j     ];
			const uint32 F = input[i      + width * jPlus ];
			const uint32 G = input[iPlus  + width * jMinus];
			const uint32 H = input[iPlus  + width * j     ];
			const uint32 I = input[iPlus  + width * jPlus ];

			if (B != H && D != F)
			{
				output[3 * i     + scaledWidth *  3 * j     ] = D == B ? D : E;
				output[3 * i     + scaledWidth * (3 * j + 1)] = (D == B && E != C) || (B == F && E != A) ? B : E;
				output[3 * i     + scaledWidth * (3 * j + 2)] = B == F ? F : E;
				output[3 * i + 1 + scaledWidth *  3 * j     ] = (D == B && E != G) || (D == H && E != A) ? D : E;
				output[3 * i + 1 + scaledWidth * (3 * j + 1)] = E;
				output[3 * i + 1 + scaledWidth * (3 * j + 2)] = (B == F && E != I) || (H == F && E != C) ? F : E;
				output[3 * i + 2 + scaledWidth *  3 * j     ] = D == H ? D : E;
				output[3 * i + 2 + scaledWidth * (3 * j + 1)] = (D == H && E != I) || (H == F && E != G) ? H : E;
				output[3 * i + 2 + scaledWidth * (3 * j + 2)] = H == F ? F : E;
			}                                       
			else
			{
				output[3 * i     + scaledWidth *  3 * j     ] = E;
				output[3 * i     + scaledWidth * (3 * j + 1)] = E;
				output[3 * i     + scaledWidth * (3 * j + 2)] = E;
				output[3 * i + 1 + scaledWidth *  3 * j     ] = E;
				output[3 * i + 1 + scaledWidth * (3 * j + 1)] = E;
				output[3 * i + 1 + scaledWidth * (3 * j + 2)] = E;
				output[3 * i + 2 + scaledWidth *  3 * j     ] = E;
				output[3 * i + 2 + scaledWidth * (3 * j + 1)] = E;
				output[3 * i + 2 + scaledWidth * (3 * j + 2)] = E;
			}
		}
	}
}